

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::fastcgi::prepare_eof(fastcgi *this)

{
  long in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  memset((void *)(in_RDI + 0x178),0,0x18);
  for (uVar1 = 0; uVar1 < 2; uVar1 = uVar1 + 1) {
    *(undefined1 *)(in_RDI + 0x178 + (ulong)uVar1 * 8) = 1;
    *(short *)(in_RDI + 0x17a + (ulong)uVar1 * 8) = (short)*(undefined4 *)(in_RDI + 0x16c);
  }
  *(undefined1 *)(in_RDI + 0x179) = 6;
  *(undefined1 *)(in_RDI + 0x181) = 3;
  *(undefined2 *)(in_RDI + 0x184) = 8;
  *(undefined1 *)(in_RDI + 0x18c) = 0;
  fcgi_header::to_net((fcgi_header *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  fcgi_header::to_net((fcgi_header *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  fcgi_end_request_body::to_net((fcgi_end_request_body *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void prepare_eof()
		{
			memset(&eof_,0,sizeof(eof_));
			for(unsigned i=0;i<2;i++) {
				eof_.headers_[i].version=fcgi_version_1;
				eof_.headers_[i].request_id=request_id_;
			}
			eof_.headers_[0].type=fcgi_stdout;
			eof_.headers_[1].type=fcgi_end_request;
			eof_.headers_[1].content_length=8;
			eof_.record_.protocol_status=fcgi_request_complete;
			eof_.headers_[0].to_net();
			eof_.headers_[1].to_net();
			eof_.record_.to_net();
		}